

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# mtrBasic.c
# Opt level: O0

MtrNode * Mtr_CopyTree(MtrNode *node,int expansion)

{
  MtrNode *pMVar1;
  MtrNode *local_30;
  MtrNode *auxnode;
  MtrNode *copy;
  int expansion_local;
  MtrNode *node_local;
  
  if (node == (MtrNode *)0x0) {
    node_local = (MtrNode *)0x0;
  }
  else if (expansion < 1) {
    node_local = (MtrNode *)0x0;
  }
  else {
    node_local = Mtr_AllocNode();
    if (node_local == (MtrNode *)0x0) {
      node_local = (MtrNode *)0x0;
    }
    else {
      node_local->younger = (MtrNode *)0x0;
      node_local->child = (MtrNode *)0x0;
      node_local->elder = (MtrNode *)0x0;
      node_local->parent = (MtrNode *)0x0;
      if (node->child != (MtrNode *)0x0) {
        pMVar1 = Mtr_CopyTree(node->child,expansion);
        node_local->child = pMVar1;
        if (node_local->child == (MtrNode *)0x0) {
          Mtr_DeallocNode(node_local);
          return (MtrNode *)0x0;
        }
      }
      if (node->younger != (MtrNode *)0x0) {
        pMVar1 = Mtr_CopyTree(node->younger,expansion);
        node_local->younger = pMVar1;
        if (node_local->younger == (MtrNode *)0x0) {
          Mtr_FreeTree(node_local);
          return (MtrNode *)0x0;
        }
      }
      node_local->flags = node->flags;
      node_local->low = node->low * expansion;
      node_local->size = node->size * expansion;
      node_local->index = node->index * expansion;
      if (node_local->younger != (MtrNode *)0x0) {
        node_local->younger->elder = node_local;
      }
      if (node_local->child != (MtrNode *)0x0) {
        for (local_30 = node_local->child; local_30 != (MtrNode *)0x0; local_30 = local_30->younger)
        {
          local_30->parent = node_local;
        }
      }
    }
  }
  return node_local;
}

Assistant:

MtrNode *
Mtr_CopyTree(
  MtrNode * node,
  int  expansion)
{
    MtrNode *copy;

    if (node == NULL) return(NULL);
    if (expansion < 1) return(NULL);
    copy = Mtr_AllocNode();
    if (copy == NULL) return(NULL);
    copy->parent = copy->elder = copy->child = copy->younger = NULL;
    if (node->child != NULL) {
        copy->child = Mtr_CopyTree(node->child, expansion);
        if (copy->child == NULL) {
            Mtr_DeallocNode(copy);
            return(NULL);
        }
    }
    if (node->younger != NULL) {
        copy->younger = Mtr_CopyTree(node->younger, expansion);
        if (copy->younger == NULL) {
            Mtr_FreeTree(copy);
            return(NULL);
        }
    }
    copy->flags = node->flags;
    copy->low = node->low * expansion;
    copy->size = node->size * expansion;
    copy->index = node->index * expansion;
    if (copy->younger) copy->younger->elder = copy;
    if (copy->child) {
        MtrNode *auxnode = copy->child;
        while (auxnode != NULL) {
            auxnode->parent = copy;
            auxnode = auxnode->younger;
        }
    }
    return(copy);

}